

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

bool __thiscall bssl::TemporaryFile::Init(TemporaryFile *this,Span<const_unsigned_char> content)

{
  int __fd;
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  char *__s_00;
  string path;
  string temp_dir;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  GetTempDir_abi_cxx11_();
  if (local_40 == 0) {
    bVar2 = false;
    goto LAB_0040b8f9;
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)local_68);
  __fd = mkstemp((char *)local_68[0]);
  if (__fd < 0) {
    __s_00 = "Could not create temporary file";
LAB_0040b933:
    perror(__s_00);
    bVar2 = false;
  }
  else {
    close(__fd);
    std::__cxx11::string::operator=((string *)this,(string *)local_68);
    if ((this->path_)._M_string_length == 0) {
LAB_0040b923:
      __s_00 = "Could not open temporary file";
      goto LAB_0040b933;
    }
    __s = fopen((this->path_)._M_dataplus._M_p,"wb");
    if (__s == (FILE *)0x0) goto LAB_0040b923;
    bVar2 = true;
    if (content.size_ != 0) {
      sVar1 = fwrite(content.data_,content.size_,1,__s);
      if (sVar1 != 1) {
        perror("Could not write temporary file");
        bVar2 = false;
      }
    }
    fclose(__s);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
LAB_0040b8f9:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar2;
}

Assistant:

bool TemporaryFile::Init(bssl::Span<const uint8_t> content) {
  std::string temp_dir = GetTempDir();
  if (temp_dir.empty()) {
    return false;
  }

#if defined(OPENSSL_WINDOWS)
  char path[MAX_PATH];
  if (GetTempFileNameA(temp_dir.c_str(), "bssl",
                       /*uUnique=*/0, path) == 0) {
    PrintLastError("Could not create temporary");
    return false;
  }
  path_ = path;
#else
  std::string path = temp_dir + "bssl_tmp_file.XXXXXX";
  int fd = mkstemp(path.data());
  if (fd < 0) {
    perror("Could not create temporary file");
    return false;
  }
  close(fd);
  path_ = std::move(path);
#endif

  ScopedFILE file = Open("wb");
  if (file == nullptr) {
    perror("Could not open temporary file");
    return false;
  }
  if (!content.empty() &&
      fwrite(content.data(), content.size(), /*nitems=*/1, file.get()) != 1) {
    perror("Could not write temporary file");
    return false;
  }
  return true;
}